

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parcor_coefficients_to_linear_predictive_coefficients.cc
# Opt level: O3

bool __thiscall
sptk::ParcorCoefficientsToLinearPredictiveCoefficients::Run
          (ParcorCoefficientsToLinearPredictiveCoefficients *this,
          vector<double,_std::allocator<double>_> *parcor_coefficients,
          vector<double,_std::allocator<double>_> *linear_predictive_coefficients,Buffer *buffer)

{
  pointer pdVar1;
  int iVar2;
  long lVar3;
  pointer pdVar4;
  size_t __n;
  bool bVar5;
  size_type __new_size;
  double *__src;
  ulong uVar6;
  int m;
  long lVar7;
  long lVar8;
  vector<double,_std::allocator<double>_> *this_00;
  
  if (this->is_valid_ == true) {
    bVar5 = false;
    if ((buffer != (Buffer *)0x0) &&
       (bVar5 = false,
       linear_predictive_coefficients != (vector<double,_std::allocator<double>_> *)0x0)) {
      iVar2 = this->num_order_;
      lVar3 = (long)(parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                    _M_impl.super__Vector_impl_data._M_start;
      __new_size = lVar3 >> 3;
      if (__new_size == (long)iVar2 + 1U) {
        if ((long)(linear_predictive_coefficients->
                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(linear_predictive_coefficients->
                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start != lVar3) {
          std::vector<double,_std::allocator<double>_>::resize
                    (linear_predictive_coefficients,__new_size);
          iVar2 = this->num_order_;
        }
        this_00 = &buffer->a_;
        if ((long)(buffer->a_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(buffer->a_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3 != (long)iVar2) {
          std::vector<double,_std::allocator<double>_>::resize(this_00,(long)iVar2);
          iVar2 = this->num_order_;
        }
        __src = (parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
        pdVar4 = (linear_predictive_coefficients->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        *pdVar4 = *__src;
        bVar5 = true;
        if (iVar2 != 0) {
          __n = (long)(parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                      _M_impl.super__Vector_impl_data._M_finish + (-8 - (long)__src);
          if (__n != 0) {
            memmove((this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start,__src,__n);
            __src = (parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                    _M_impl.super__Vector_impl_data._M_start;
            pdVar4 = (linear_predictive_coefficients->
                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            iVar2 = this->num_order_;
          }
          if (1 < iVar2) {
            pdVar1 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar6 = 2;
            lVar3 = 8;
            do {
              lVar7 = 1;
              lVar8 = lVar3;
              do {
                pdVar4[lVar7] = __src[uVar6] * *(double *)((long)pdVar1 + lVar8) + pdVar1[lVar7];
                lVar7 = lVar7 + 1;
                lVar8 = lVar8 + -8;
              } while (lVar8 != 0);
              lVar8 = 0;
              do {
                *(undefined8 *)((long)pdVar1 + lVar8 + 8) =
                     *(undefined8 *)((long)pdVar4 + lVar8 + 8);
                lVar8 = lVar8 + 8;
              } while (lVar3 != lVar8);
              uVar6 = uVar6 + 1;
              lVar3 = lVar3 + 8;
            } while (uVar6 != iVar2 + 1);
          }
          pdVar4[iVar2] = __src[iVar2];
        }
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ParcorCoefficientsToLinearPredictiveCoefficients::Run(
    const std::vector<double>& parcor_coefficients,
    std::vector<double>* linear_predictive_coefficients,
    ParcorCoefficientsToLinearPredictiveCoefficients::Buffer* buffer) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      parcor_coefficients.size() != static_cast<std::size_t>(length) ||
      NULL == linear_predictive_coefficients || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (linear_predictive_coefficients->size() !=
      static_cast<std::size_t>(length)) {
    linear_predictive_coefficients->resize(length);
  }
  if (buffer->a_.size() != static_cast<std::size_t>(num_order_)) {
    buffer->a_.resize(num_order_);
  }

  // Copy gain.
  (*linear_predictive_coefficients)[0] = parcor_coefficients[0];
  if (0 == num_order_) {
    return true;
  }

  // Set initial condition.
  std::copy(parcor_coefficients.begin(), parcor_coefficients.end() - 1,
            buffer->a_.begin());

  // Apply recursive formula.
  const double* k(&(parcor_coefficients[0]));
  double* prev_a(&buffer->a_[0]);
  double* a(&((*linear_predictive_coefficients)[0]));
  for (int i(2); i <= num_order_; ++i) {
    for (int m(1); m < i; ++m) {
      a[m] = prev_a[m] + k[i] * prev_a[i - m];
    }
    for (int m(1); m < i; ++m) {
      prev_a[m] = a[m];
    }
  }
  a[num_order_] = k[num_order_];

  return true;
}